

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

SQInteger __thiscall SQBlob::Write(SQBlob *this,void *buffer,SQInteger size)

{
  bool bVar1;
  size_t in_RDX;
  SQBlob *in_RSI;
  SQBlob *in_RDI;
  
  bVar1 = CanAdvance(in_RDI,in_RDX);
  if (!bVar1) {
    GrowBufOf(in_RSI,in_RDX);
  }
  memcpy(in_RDI->_buf + in_RDI->_ptr,in_RSI,in_RDX);
  in_RDI->_ptr = in_RDX + in_RDI->_ptr;
  return in_RDX;
}

Assistant:

SQInteger Write(void *buffer, SQInteger size) {
        if(!CanAdvance(size)) {
            GrowBufOf(_ptr + size - _size);
        }
        memcpy(&_buf[_ptr], buffer, size);
        _ptr += size;
        return size;
    }